

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void delete_reopen_test(void)

{
  int iVar1;
  int iVar2;
  size_t valueSize;
  void *value;
  fdb_config fconfig;
  fdb_status status;
  fdb_kvs_handle *db;
  fdb_file_handle *fh;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_file_handle *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  fdb_isolation_level_t in_stack_fffffffffffffd97;
  fdb_file_handle *in_stack_fffffffffffffd98;
  undefined1 local_260 [7];
  fdb_commit_opt_t in_stack_fffffffffffffda7;
  fdb_file_handle *in_stack_fffffffffffffda8;
  void **in_stack_fffffffffffffdb0;
  fdb_kvs_handle *in_stack_fffffffffffffdb8;
  void *in_stack_fffffffffffffdc0;
  fdb_kvs_handle *in_stack_fffffffffffffdc8;
  undefined1 local_168 [8];
  undefined8 local_160;
  undefined8 local_f0;
  fdb_status local_6c;
  undefined4 in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fdb_file_handle **in_stack_ffffffffffffffb8;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  iVar1 = system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_168,local_260,0xf8);
  local_160 = 0;
  local_f0 = 1;
  local_6c = fdb_open(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                      (fdb_config *)CONCAT44(iVar1,in_stack_ffffffffffffffa8));
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1d5);
    delete_reopen_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1d5,"void delete_reopen_test()");
    }
  }
  local_6c = fdb_kvs_open_default
                       ((fdb_file_handle *)
                        CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                        &in_stack_fffffffffffffd88->root,(fdb_kvs_config *)0x107f5a);
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1d8);
    delete_reopen_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1d8,"void delete_reopen_test()");
    }
  }
  local_6c = fdb_begin_transaction(in_stack_fffffffffffffd98,in_stack_fffffffffffffd97);
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1db);
    delete_reopen_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1db,"void delete_reopen_test()");
    }
  }
  local_6c = fdb_set_kv(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                        (size_t)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        (size_t)in_stack_fffffffffffffda8);
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1de);
    delete_reopen_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1de,"void delete_reopen_test()");
    }
  }
  local_6c = fdb_end_transaction(in_stack_fffffffffffffda8,in_stack_fffffffffffffda7);
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1e1);
    delete_reopen_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1e1,"void delete_reopen_test()");
    }
  }
  local_6c = fdb_get_kv(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                        (size_t)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        (size_t *)in_stack_fffffffffffffda8);
  if (local_6c != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1e6);
    delete_reopen_test::__test_pass = 0;
    if (local_6c != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1e6,"void delete_reopen_test()");
    }
  }
  if (CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90) != 5) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1e8);
    delete_reopen_test::__test_pass = 0;
    if (CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90) != 5) {
      __assert_fail("valueSize == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1e8,"void delete_reopen_test()");
    }
  }
  iVar2 = memcmp(in_stack_fffffffffffffd98,"value",5);
  if (iVar2 == 0) {
    fdb_free_block((void *)0x1082c0);
    local_6c = fdb_begin_transaction(in_stack_fffffffffffffd98,in_stack_fffffffffffffd97);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1ed);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1ed,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_del_kv(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                          (size_t)in_stack_fffffffffffffda8);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1f0);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1f0,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_end_transaction(in_stack_fffffffffffffda8,in_stack_fffffffffffffda7);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,499);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,499,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_get_kv(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                          (size_t)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                          (size_t *)in_stack_fffffffffffffda8);
    if (local_6c != FDB_RESULT_KEY_NOT_FOUND) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1f6);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_KEY_NOT_FOUND) {
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1f6,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_close(in_stack_fffffffffffffd88);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1f9);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1f9,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_open(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        (fdb_config *)CONCAT44(iVar1,in_stack_ffffffffffffffa8));
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x1fd);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x1fd,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_kvs_open_default
                         ((fdb_file_handle *)
                          CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                          &in_stack_fffffffffffffd88->root,(fdb_kvs_config *)0x1085e7);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x200);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x200,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_get_kv(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                          (size_t)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                          (size_t *)in_stack_fffffffffffffda8);
    if (local_6c != FDB_RESULT_KEY_NOT_FOUND) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x203);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_KEY_NOT_FOUND) {
        __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x203,"void delete_reopen_test()");
      }
    }
    local_6c = fdb_close(in_stack_fffffffffffffd88);
    if (local_6c != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x206);
      delete_reopen_test::__test_pass = 0;
      if (local_6c != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x206,"void delete_reopen_test()");
      }
    }
    fdb_shutdown();
    memleak_end();
    if (delete_reopen_test::__test_pass == 0) {
      fprintf(_stderr,"%s FAILED\n","end trans delete & reopen passed");
    }
    else {
      fprintf(_stderr,"%s PASSED\n","end trans delete & reopen passed");
    }
    return;
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n","value",in_stack_fffffffffffffd98,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x1e9);
  delete_reopen_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x1e9,"void delete_reopen_test()");
}

Assistant:

void delete_reopen_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *fh;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size = 0;
    fconfig.num_compactor_threads = 1;
    status = fdb_open(&fh, "./dummy3", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(fh, &db, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_begin_transaction(fh, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_kv(db, (void *) "foo", 3, (void *)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_end_transaction(fh, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    void *value;
    size_t valueSize;
    status = fdb_get_kv(db, (void*)"foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CHK(valueSize == 5);
    TEST_CMP(value, "value", 5);
    fdb_free_block(value);

    status = fdb_begin_transaction(fh, FDB_ISOLATION_READ_COMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_del_kv(db, "foo", 3);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_end_transaction(fh, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kv(db, "foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    status = fdb_close(fh);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Reopen:
    status = fdb_open(&fh, "./dummy3", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_kvs_open_default(fh, &db, NULL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kv(db, "foo", 3, &value, &valueSize);
    TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

    status = fdb_close(fh);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("end trans delete & reopen passed");
}